

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O2

void __thiscall
ProtocolARP::Add(ProtocolARP *this,uint8_t *protocolAddress,uint8_t *hardwareAddress)

{
  ARPCacheEntry *pAVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  undefined4 extraout_var;
  long lVar7;
  uint8_t uVar8;
  ARPCacheEntry *pAVar9;
  size_t j;
  ulong uVar10;
  size_t j_1;
  
  uVar3 = LocateProtocolAddress(this,protocolAddress);
  pAVar1 = this->Cache;
  if ((int)uVar3 < 0) {
    pAVar9 = pAVar1;
    for (uVar5 = 0; uVar5 != 5; uVar5 = uVar5 + 1) {
      if (pAVar9->Age == '\0') goto LAB_00105588;
      pAVar9 = pAVar9 + 1;
    }
    uVar10 = 1;
    uVar5 = 0;
    for (lVar7 = 0; lVar7 != 0x2c; lVar7 = lVar7 + 0xb) {
      uVar2 = uVar10;
      if (this->Cache[1].IPv4Address[lVar7 + -1] <= pAVar1[(int)uVar5].Age) {
        uVar2 = uVar5;
      }
      uVar5 = uVar2;
      uVar10 = (ulong)((int)uVar10 + 1);
    }
LAB_00105588:
    uVar5 = uVar5 & 0xffffffff;
    pAVar1[uVar5].Age = '\x01';
    uVar10 = 0;
    while( true ) {
      sVar6 = ProtocolIPv4::AddressSize(this->IP);
      if (sVar6 <= uVar10) break;
      pAVar1[uVar5].IPv4Address[uVar10] = protocolAddress[uVar10];
      uVar10 = uVar10 + 1;
    }
    uVar10 = 0;
    while( true ) {
      iVar4 = (*this->MAC->_vptr_InterfaceMAC[3])();
      if (CONCAT44(extraout_var,iVar4) <= uVar10) break;
      pAVar1[uVar5].MACAddress[uVar10] = hardwareAddress[uVar10];
      uVar10 = uVar10 + 1;
    }
  }
  else {
    pAVar1[uVar3].Age = '\x01';
  }
  for (lVar7 = 0; lVar7 != 0x37; lVar7 = lVar7 + 0xb) {
    uVar8 = this->Cache[0].IPv4Address[lVar7 + -1];
    if (uVar8 != '\0') {
      uVar8 = uVar8 + '\x01';
      if (uVar8 == 0xff) {
        uVar8 = '\0';
      }
      this->Cache[0].IPv4Address[lVar7 + -1] = uVar8;
    }
  }
  return;
}

Assistant:

void ProtocolARP::Add(const uint8_t* protocolAddress, const uint8_t* hardwareAddress)
{
    int index;
    uint32_t i;
    int oldest;

    index = LocateProtocolAddress(protocolAddress);
    if (index >= 0)
    {
        // Found entry in table, reset it's age
        Cache[index].Age = 1;
    }
    else
    {
        // Not already in table;
        for (i = 0; i < ARPCacheSize; i++)
        {
            if (Cache[i].Age == 0)
            {
                // Entry not used, take it
                break;
            }
        }
        if (i == ARPCacheSize)
        {
            // Table is full, steal the oldest entry
            oldest = 0;
            for (i = 1; i < ARPCacheSize; i++)
            {
                if (Cache[i].Age > Cache[oldest].Age)
                {
                    oldest = i;
                }
            }
            i = oldest;
        }

        // At this point i is the entry we want to use
        Cache[i].Age = 1;
        for (size_t j = 0; j < IP.AddressSize(); j++)
        {
            Cache[i].IPv4Address[j] = protocolAddress[j];
        }
        for (size_t j = 0; j < MAC.AddressSize(); j++)
        {
            Cache[i].MACAddress[j] = hardwareAddress[j];
        }
    }

    // Age the list
    for (i = 0; i < ARPCacheSize; i++)
    {
        if (Cache[i].Age != 0)
        {
            Cache[i].Age++;
            if (Cache[i].Age == 0xFF)
            {
                // Flush this entry
                Cache[i].Age = 0;
            }
        }
    }
}